

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D.c
# Opt level: O1

int Jac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  long *plVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  SUNMatZero(J);
  lVar14 = *user_data;
  if (2 < lVar14) {
    dVar3 = *(double *)((long)user_data + 8);
    lVar7 = *(long *)((long)J->content + 0x28);
    lVar12 = lVar14 + -2;
    plVar11 = (long *)(*(long *)((long)J->content + 0x40) + 0x40);
    do {
      *(double *)(plVar11[-8] + 0x18 + lVar7 * 8) =
           (*(double *)((long)user_data + 0x20) / dVar3) / dVar3 +
           *(double *)(plVar11[-8] + 0x18 + lVar7 * 8);
      *(double *)(plVar11[-7] + 0x18 + lVar7 * 8) =
           (*(double *)((long)user_data + 0x28) / dVar3) / dVar3 +
           *(double *)(plVar11[-7] + 0x18 + lVar7 * 8);
      *(double *)(plVar11[-6] + 0x18 + lVar7 * 8) =
           (*(double *)((long)user_data + 0x30) / dVar3) / dVar3 +
           *(double *)(plVar11[-6] + 0x18 + lVar7 * 8);
      *(double *)(plVar11[-5] + lVar7 * 8) =
           *(double *)(plVar11[-5] + lVar7 * 8) -
           ((*(double *)((long)user_data + 0x20) + *(double *)((long)user_data + 0x20)) / dVar3) /
           dVar3;
      *(double *)(plVar11[-4] + lVar7 * 8) =
           *(double *)(plVar11[-4] + lVar7 * 8) -
           ((*(double *)((long)user_data + 0x28) + *(double *)((long)user_data + 0x28)) / dVar3) /
           dVar3;
      *(double *)(plVar11[-3] + lVar7 * 8) =
           *(double *)(plVar11[-3] + lVar7 * 8) -
           ((*(double *)((long)user_data + 0x30) + *(double *)((long)user_data + 0x30)) / dVar3) /
           dVar3;
      *(double *)(plVar11[-2] + -0x18 + lVar7 * 8) =
           (*(double *)((long)user_data + 0x20) / dVar3) / dVar3 +
           *(double *)(plVar11[-2] + -0x18 + lVar7 * 8);
      *(double *)(plVar11[-1] + -0x18 + lVar7 * 8) =
           (*(double *)((long)user_data + 0x28) / dVar3) / dVar3 +
           *(double *)(plVar11[-1] + -0x18 + lVar7 * 8);
      *(double *)(*plVar11 + -0x18 + lVar7 * 8) =
           (*(double *)((long)user_data + 0x30) / dVar3) / dVar3 +
           *(double *)(*plVar11 + -0x18 + lVar7 * 8);
      plVar11 = plVar11 + 3;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  dVar3 = *(double *)((long)user_data + 0x38);
  lVar12 = N_VGetArrayPointer(y);
  if (lVar12 == 0) {
    Jac_cold_1();
  }
  else if (2 < lVar14) {
    lVar7 = *(long *)((long)J->content + 0x28);
    lVar8 = *(long *)((long)J->content + 0x40);
    lVar14 = lVar14 + -2;
    lVar13 = 0x28;
    do {
      dVar4 = *(double *)(lVar12 + -0x10 + lVar13);
      dVar5 = *(double *)(lVar12 + lVar13);
      lVar9 = *(long *)(lVar8 + -0x10 + lVar13);
      dVar6 = *(double *)(lVar12 + -8 + lVar13);
      pdVar1 = (double *)(lVar9 + lVar7 * 8);
      dVar10 = pdVar1[1];
      pdVar2 = (double *)(lVar9 + lVar7 * 8);
      *pdVar2 = *pdVar1 + -(dVar5 + 1.0) + dVar6 * (dVar4 + dVar4);
      pdVar2[1] = dVar10 + dVar5 + dVar6 * -(dVar4 + dVar4);
      *(double *)(lVar9 + 0x10 + lVar7 * 8) = *(double *)(lVar9 + 0x10 + lVar7 * 8) - dVar5;
      lVar9 = *(long *)(lVar8 + -8 + lVar13);
      *(double *)(lVar9 + -8 + lVar7 * 8) = *(double *)(lVar9 + -8 + lVar7 * 8) + dVar4 * dVar4;
      *(double *)(lVar9 + lVar7 * 8) = *(double *)(lVar9 + lVar7 * 8) - dVar4 * dVar4;
      lVar9 = *(long *)(lVar8 + lVar13);
      *(double *)(lVar9 + -0x10 + lVar7 * 8) = *(double *)(lVar9 + -0x10 + lVar7 * 8) - dVar4;
      pdVar1 = (double *)(lVar9 + -8 + lVar7 * 8);
      dVar5 = pdVar1[1];
      pdVar2 = (double *)(lVar9 + -8 + lVar7 * 8);
      *pdVar2 = dVar4 + *pdVar1;
      pdVar2[1] = (-1.0 / dVar3 - dVar4) + dVar5;
      lVar13 = lVar13 + 0x18;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  return 0;
}

Assistant:

static int Jac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  UserData udata = (UserData)user_data; /* access problem data */
  SUNMatZero(J);                        /* Initialize Jacobian to zero */

  /* Fill in the Laplace matrix */
  LaplaceMatrix(SUN_RCONST(1.0), J, udata);

  /* Add in the Jacobian of the reaction terms matrix */
  ReactionJac(SUN_RCONST(1.0), y, J, udata);

  return 0; /* Return with success */
}